

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O2

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  json_index_t jVar1;
  jsonChildren *pjVar2;
  uint uVar3;
  JSONNode **ppJVar4;
  uint uVar5;
  uint uVar6;
  size_t count;
  allocator aStack_41;
  undefined1 auStack_40 [8];
  string asStack_38 [24];
  
  pjVar2 = *mine;
  if (pjVar2->array == (JSONNode **)0x0) {
    std::__cxx11::string::string((string *)auStack_40,"Children is null reserve",&aStack_41);
    JSONDebug::_JSON_ASSERT(true,(json_string *)auStack_40);
    std::__cxx11::string::~string((string *)auStack_40);
    ppJVar4 = pjVar2->array;
    std::__cxx11::string::string
              ((string *)auStack_40,"reserve is not meant to expand a preexisting array",&aStack_41)
    ;
    JSONDebug::_JSON_ASSERT(ppJVar4 == (JSONNode **)0x0,(json_string *)auStack_40);
    std::__cxx11::string::~string((string *)auStack_40);
    jVar1 = pjVar2->mycapacity;
    std::__cxx11::string::string
              ((string *)auStack_40,"reservec is not meant to expand a preexisting array",&aStack_41
              );
    JSONDebug::_JSON_ASSERT(jVar1 == 0,(json_string *)auStack_40);
    std::__cxx11::string::~string((string *)auStack_40);
    jVar1 = pjVar2->mysize;
    std::__cxx11::string::string
              ((string *)auStack_40,"reserves is not meant to expand a preexisting array",&aStack_41
              );
    JSONDebug::_JSON_ASSERT(jVar1 == 0,(json_string *)auStack_40);
    std::__cxx11::string::~string((string *)auStack_40);
    pjVar2->mycapacity = amount;
    ppJVar4 = (JSONNode **)malloc((ulong)amount << 3);
    std::__cxx11::string::string((string *)auStack_40,"Out of memory",&aStack_41);
    JSONDebug::_JSON_ASSERT(ppJVar4 != (JSONNode **)0x0,(json_string *)auStack_40);
    std::__cxx11::string::~string((string *)auStack_40);
    pjVar2->array = ppJVar4;
    return;
  }
  uVar6 = amount - pjVar2->mycapacity;
  if (amount < pjVar2->mycapacity || uVar6 == 0) {
    return;
  }
  std::__cxx11::string::string
            (asStack_38,"Children is null inc(amount)",(allocator *)(auStack_40 + 7));
  JSONDebug::_JSON_ASSERT(true,(json_string *)asStack_38);
  std::__cxx11::string::~string(asStack_38);
  if (uVar6 != 0) {
    uVar3 = pjVar2->mysize + uVar6;
    uVar5 = pjVar2->mycapacity;
    if (uVar5 <= uVar3) {
      if (uVar5 == 0) {
        ppJVar4 = pjVar2->array;
        std::__cxx11::string::string
                  (asStack_38,"Expanding a 0 capacity array, but not null",
                   (allocator *)(auStack_40 + 7));
        JSONDebug::_JSON_ASSERT(ppJVar4 == (JSONNode **)0x0,(json_string *)asStack_38);
        std::__cxx11::string::~string(asStack_38);
        count = 8;
        if (8 < uVar6) {
          count = (size_t)uVar6;
        }
        ppJVar4 = json_malloc<JSONNode*>(count);
        pjVar2->array = ppJVar4;
        pjVar2->mycapacity = (json_index_t)count;
      }
      else {
        while (uVar5 < uVar3) {
          uVar5 = uVar5 * 2;
          pjVar2->mycapacity = uVar5;
        }
        ppJVar4 = json_realloc<JSONNode*>(pjVar2->array,(ulong)uVar5);
        pjVar2->array = ppJVar4;
      }
    }
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}